

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

int vector_equal(vector_t *vec1,vector_t *vec2)

{
  ulong local_28;
  size_t i;
  vector_t *vec2_local;
  vector_t *vec1_local;
  
  if (vec1->size == vec2->size) {
    for (local_28 = 0; local_28 < vec1->size; local_28 = local_28 + 1) {
      if (vec1->values[local_28] != vec2->values[local_28]) {
        return 0;
      }
    }
    vec1_local._4_4_ = 1;
  }
  else {
    vec1_local._4_4_ = 0;
  }
  return vec1_local._4_4_;
}

Assistant:

int vector_equal(struct vector_t *vec1, struct vector_t *vec2)
{
  if (vec1->size != vec2->size)
    return 0;
  for (size_t i = 0; i < vec1->size; i++)
    if (vec1->values[i] != vec2->values[i])
      return 0;
  return 1;
}